

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_handler.h
# Opt level: O2

DiagnosticStream * __thiscall
spvtools::AssemblyContext::diagnostic
          (DiagnosticStream *__return_storage_ptr__,AssemblyContext *this,spv_result_t error)

{
  spv_position_t position;
  allocator<char> local_59;
  size_t local_58;
  size_t sStack_50;
  size_t local_48;
  string local_40;
  
  local_48 = (this->current_position_).index;
  local_58 = (this->current_position_).line;
  sStack_50 = (this->current_position_).column;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_59);
  position.column = sStack_50;
  position.line = local_58;
  position.index = local_48;
  DiagnosticStream::DiagnosticStream
            (__return_storage_ptr__,position,&this->consumer_,&local_40,error);
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

DiagnosticStream diagnostic(spv_result_t error) {
    return DiagnosticStream(current_position_, consumer_, "", error);
  }